

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_RingModulator.cpp
# Opt level: O2

int RingModulator::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  int iVar1;
  EffectData *pEVar2;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<RingModulator::EffectData>(state);
  if (index < 2) {
    if (value != (float *)0x0) {
      *value = *(float *)((long)&pEVar2->field_0 + (long)index * 4);
    }
    iVar1 = 0;
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        if (value != NULL)
            *value = data->p[index];
        if (valuestr != NULL)
            valuestr[0] = 0;
        return UNITY_AUDIODSP_OK;
    }